

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

quaternion * quaternion_rotate_by_axis_angle_EXP(quaternion *self,vector3 *axis,double angle)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  quaternion *pqVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 local_58 [24];
  double dStack_40;
  undefined1 local_38 [16];
  double local_28;
  undefined8 uStack_20;
  double local_18;
  double dStack_10;
  
  local_28 = (axis->field_0).v[2];
  uStack_20 = 0;
  local_18 = (axis->field_0).v[0];
  dStack_10 = (axis->field_0).v[1];
  dVar1 = sin(angle * 0.5);
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = dVar1;
  local_38._12_4_ = extraout_XMM0_Dd;
  dStack_40 = cos(angle * 0.5);
  auVar6._0_8_ = local_28 * (double)local_38._0_8_;
  local_58._0_8_ = (double)local_38._0_8_ * local_18;
  local_58._8_8_ = (double)local_38._0_8_ * dStack_10;
  local_58._16_8_ = auVar6._0_8_;
  dVar1 = SQRT(dStack_40 * dStack_40 +
               auVar6._0_8_ * auVar6._0_8_ +
               local_58._0_8_ * local_58._0_8_ + local_58._8_8_ * local_58._8_8_);
  if (1e-05 <= dVar1) {
    uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
    auVar2._8_4_ = SUB84(dVar1,0);
    auVar2._0_8_ = dVar1;
    auVar2._12_4_ = uVar5;
    local_58._0_16_ = divpd(local_58._0_16_,auVar2);
    auVar6._8_8_ = dStack_40;
    auVar3._8_4_ = SUB84(dVar1,0);
    auVar3._0_8_ = dVar1;
    auVar3._12_4_ = uVar5;
    register0x000012c0 = divpd(auVar6,auVar3);
  }
  quaternion_multiply(self,(quaternion *)local_58);
  pqVar4 = quaternion_normalize(self);
  return pqVar4;
}

Assistant:

HYPAPI struct quaternion *quaternion_rotate_by_axis_angle_EXP(struct quaternion *self, const struct vector3 *axis, HYP_FLOAT angle)
{
	struct quaternion qT;

	quaternion_set_from_axis_anglev3(&qT, axis, angle);
	quaternion_rotate_by_quaternion_EXP(self, &qT);

	return self;
}